

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O3

bool __thiscall
S2MinDistanceCellUnionTarget::UpdateMinDistance
          (S2MinDistanceCellUnionTarget *this,S2Point *v0,S2Point *v1,S2MinDistance *min_dist)

{
  S2ClosestCellQuery *pSVar1;
  Result r;
  Result local_80;
  Options local_68;
  Target local_48;
  VType local_40;
  VType VStack_38;
  VType local_30;
  VType local_28;
  VType VStack_20;
  VType local_18;
  
  local_30 = v0->c_[2];
  local_40 = v0->c_[0];
  VStack_38 = v0->c_[1];
  local_28 = v1->c_[0];
  VStack_20 = v1->c_[1];
  local_18 = v1->c_[2];
  local_48._vptr_S2DistanceTarget = (_func_int **)&PTR__S2DistanceTarget_002bb928;
  *(double *)
   &(((this->query_)._M_t.
      super___uniq_ptr_impl<S2ClosestCellQuery,_std::default_delete<S2ClosestCellQuery>_>._M_t.
      super__Tuple_impl<0UL,_S2ClosestCellQuery_*,_std::default_delete<S2ClosestCellQuery>_>.
      super__Head_base<0UL,_S2ClosestCellQuery_*,_false>._M_head_impl)->options_).super_Options =
       (min_dist->super_S1ChordAngle).length2_;
  pSVar1 = (this->query_)._M_t.
           super___uniq_ptr_impl<S2ClosestCellQuery,_std::default_delete<S2ClosestCellQuery>_>._M_t.
           super__Tuple_impl<0UL,_S2ClosestCellQuery_*,_std::default_delete<S2ClosestCellQuery>_>.
           super__Head_base<0UL,_S2ClosestCellQuery_*,_false>._M_head_impl;
  local_68.max_distance_.super_S1ChordAngle.length2_ =
       *(S1ChordAngle *)&(pSVar1->options_).super_Options;
  local_68.max_error_.length2_ = ((Delta *)((long)&(pSVar1->options_).super_Options + 8))->length2_;
  local_68.region_ = *(S2Region **)((long)&(pSVar1->options_).super_Options + 0x10);
  local_68._28_4_ =
       SUB84((ulong)*(undefined8 *)((long)&(pSVar1->options_).super_Options + 0x18) >> 0x20,0);
  local_68.max_results_ = 1;
  S2ClosestCellQueryBase<S2MinDistance>::FindClosestCell
            (&local_80,&pSVar1->base_,&local_48,&local_68);
  if (local_80.cell_id_.id_ != 0) {
    (min_dist->super_S1ChordAngle).length2_ = (double)local_80.distance_;
  }
  return local_80.cell_id_.id_ != 0;
}

Assistant:

bool S2MinDistanceCellUnionTarget::UpdateMinDistance(
    const S2Point& v0, const S2Point& v1, S2MinDistance* min_dist) {
  S2ClosestCellQuery::EdgeTarget target(v0, v1);
  return UpdateMinDistance(&target, min_dist);
}